

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateQualifiedName(DescriptorBuilder *this,string *name)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  int local_28;
  int i;
  bool last_was_period;
  string *name_local;
  DescriptorBuilder *this_local;
  
  bVar1 = 0;
  local_28 = 0;
  do {
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= (ulong)(long)local_28) {
      uVar2 = std::__cxx11::string::empty();
      this_local._7_1_ = false;
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = (bool)(bVar1 ^ 1);
      }
      return this_local._7_1_;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name);
    if ((((*pcVar4 < 'a') ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name), 'z' < *pcVar4)) &&
        ((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar4 < 'A' ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name), 'Z' < *pcVar4)))) &&
       (((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar4 < '0' ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name), '9' < *pcVar4)) &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar4 != '_')))) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)name);
      if (*pcVar4 != '.') {
        return false;
      }
      if (bVar1 != 0) {
        return false;
      }
      bVar1 = 1;
    }
    else {
      bVar1 = 0;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool DescriptorBuilder::ValidateQualifiedName(const string& name) {
  bool last_was_period = false;

  for (int i = 0; i < name.size(); i++) {
    // I don't trust isalnum() due to locales.  :(
    if (('a' <= name[i] && name[i] <= 'z') ||
        ('A' <= name[i] && name[i] <= 'Z') ||
        ('0' <= name[i] && name[i] <= '9') ||
        (name[i] == '_')) {
      last_was_period = false;
    } else if (name[i] == '.') {
      if (last_was_period) return false;
      last_was_period = true;
    } else {
      return false;
    }
  }

  return !name.empty() && !last_was_period;
}